

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_object_effect(parser *p)

{
  long *plVar1;
  parser_error pVar2;
  void *pvVar3;
  effect *effect;
  long *plVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    return PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  effect = (effect *)mem_zalloc(0x38);
  plVar1 = *(long **)((long)pvVar3 + 0x248);
  if (*(long **)((long)pvVar3 + 0x248) == (long *)0x0) {
    plVar4 = (long *)((long)pvVar3 + 0x248);
  }
  else {
    do {
      plVar4 = plVar1;
      plVar1 = (long *)*plVar4;
    } while ((long *)*plVar4 != (long *)0x0);
  }
  *plVar4 = (long)effect;
  pVar2 = grab_effect_data(p,effect);
  return pVar2;
}

Assistant:

static enum parser_error parse_object_effect(struct parser *p) {
	struct object_kind *k = parser_priv(p);
	struct effect *effect, *new_effect;

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Go to the next vacant effect and set it to the new one  */
	new_effect = mem_zalloc(sizeof(*new_effect));
	if (k->effect) {
		effect = k->effect;
		while (effect->next) effect = effect->next;
		effect->next = new_effect;
	} else {
		k->effect = new_effect;
	}
	/* Fill in the detail */
	return grab_effect_data(p, new_effect);
}